

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

double fas154x_seas(double *b,int pq,void *params)

{
  uint ip;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  double *A;
  double *P;
  int iVar9;
  double *phi;
  double *theta;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  size_t __size;
  double dVar18;
  double extraout_XMM0_Qa;
  double dVar19;
  double local_a0;
  double ssq;
  double sumlog;
  ulong local_88;
  long local_80;
  double *local_78;
  int local_6c;
  int local_68;
  int nit;
  int iter;
  uint local_54;
  double *local_50;
  double *local_48;
  int local_3c;
  double local_38;
  
  ssq = 0.0;
  local_a0 = 0.0;
  uVar1 = *params;
  local_3c = *(int *)((long)params + 0xc);
  _iter = (ulong)local_3c;
  uVar2 = *(uint *)((long)params + 8);
  uVar3 = *(uint *)((long)params + 0x10);
  uVar15 = (ulong)uVar3;
  local_54 = uVar3 * local_3c;
  uVar4 = *(uint *)((long)params + 0x18);
  local_3c = uVar4 * local_3c;
  iVar9 = *(int *)((long)params + 0x1c);
  local_48 = (double *)(long)iVar9;
  iVar5 = *(int *)((long)params + 0x28);
  local_88 = (ulong)iVar5;
  uVar6 = *(uint *)((long)params + 0x2c);
  iVar7 = *(int *)((long)params + 0x50);
  local_80 = (long)iVar7;
  local_38 = (double)CONCAT44(local_38._4_4_,((iVar9 + 1) * iVar9) / 2);
  __size = (long)local_48 << 3;
  iVar9 = uVar2 + uVar1 + uVar3;
  nit = iVar9 + uVar4;
  sumlog = (double)params;
  local_50 = (double *)__size;
  phi = (double *)malloc(__size);
  theta = (double *)malloc(__size);
  local_78 = (double *)malloc((size_t)local_50);
  local_38 = (double)((long)local_38._0_4_ << 3);
  local_50 = (double *)malloc((size_t)local_38);
  pdVar10 = (double *)malloc((size_t)local_38);
  P = local_50;
  A = local_78;
  uVar14 = 0;
  uVar12 = 0;
  if (0 < (int)local_48) {
    uVar12 = (ulong)local_48 & 0xffffffff;
  }
  for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
    phi[uVar14] = 0.0;
    theta[uVar14] = 0.0;
  }
  ip = local_54 + uVar1;
  local_38 = (double)((long)sumlog + 0x58);
  uVar12 = 0;
  uVar14 = 0;
  if (0 < (int)uVar1) {
    uVar14 = (ulong)uVar1;
  }
  for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
    phi[uVar12] = b[uVar12];
  }
  local_3c = local_3c + uVar2;
  uVar13 = 0;
  uVar12 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar12 = uVar13;
  }
  for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
    theta[uVar13] = b[(long)(int)uVar1 + uVar13];
  }
  uVar13 = 0;
  if ((int)uVar3 < 1) {
    uVar15 = 0;
  }
  pdVar11 = phi;
  while (pdVar11 = pdVar11 + _iter, uVar13 != uVar15) {
    dVar18 = b[(long)(int)(uVar2 + uVar1) + uVar13];
    uVar13 = uVar13 + 1;
    phi[uVar13 * _iter + -1] = phi[uVar13 * _iter + -1] + dVar18;
    for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
      pdVar11[uVar16] = pdVar11[uVar16] - b[uVar16] * dVar18;
    }
  }
  uVar15 = 0;
  pdVar11 = theta;
  uVar14 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar14 = uVar15;
  }
  while (pdVar11 = pdVar11 + _iter, uVar15 != uVar14) {
    dVar18 = b[(long)iVar9 + uVar15];
    uVar15 = uVar15 + 1;
    theta[uVar15 * _iter + -1] = theta[uVar15 * _iter + -1] + dVar18;
    for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      pdVar11[uVar13] = b[(long)(int)uVar1 + uVar13] * dVar18 + pdVar11[uVar13];
    }
  }
  if (0 < (int)uVar6) {
    pdVar11 = (double *)((long)local_38 + (long)(iVar5 * 3 + iVar7) * 8);
    uVar12 = 0;
    uVar14 = 0;
    if (0 < (int)local_88) {
      uVar14 = local_88 & 0xffffffff;
    }
    for (; uVar12 != uVar14; uVar12 = uVar12 + 1) {
      dVar18 = *(double *)
                ((long)local_38 + (uVar12 + (long)((int)local_80 + (int)local_88 * 2)) * 8);
      pdVar17 = pdVar11;
      for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
        dVar18 = dVar18 - *pdVar17 * b[(long)nit + uVar15];
        pdVar17 = pdVar17 + local_88;
      }
      *(double *)((long)local_38 + (uVar12 + local_80) * 8) = dVar18;
      pdVar11 = pdVar11 + 1;
    }
  }
  bVar8 = 1 < ip || local_3c != 0;
  local_54 = ip;
  local_48 = pdVar10;
  if (bVar8) {
    starma(ip,local_3c,phi,theta,local_78,local_50,pdVar10);
    dVar18 = extraout_XMM0_Qa;
  }
  else {
    *pdVar10 = 1.0;
    *local_78 = 0.0;
    dVar18 = *phi * *phi;
    *local_50 = 1.0 / (1.0 - dVar18);
  }
  pdVar11 = local_48;
  _iter = (ulong)bVar8;
  local_6c = 0;
  pdVar10 = (double *)((long)local_38 + local_80 * 8);
  karma(ip,local_3c,phi,&ssq,A,P,local_48,(int)local_88,pdVar10,pdVar10 + local_88,&ssq,&local_a0,
        (uint)bVar8,dVar18,&local_68,&local_6c);
  dVar18 = sumlog;
  *(double *)((long)sumlog + 0x40) = local_a0;
  local_38 = ssq / (double)local_68;
  dVar19 = log(local_a0 / (double)local_68);
  local_38 = (dVar19 + local_38) * 0.5;
  *(double *)((long)dVar18 + 0x48) = local_38;
  free(phi);
  free(theta);
  free(A);
  free(local_50);
  free(pdVar11);
  return local_38;
}

Assistant:

double fas154x_seas(double *b, int pq, void *params) {
	double value, ssq, sumlog, delta,temp;
	int p, q, ps, qs,s,offset,naram,M;
	int ip, iq, ir, i,j, np, ifault, N, iupd, nit, iter;
	double *phi, *theta, *A, *P, *V,*reg;

	value = ssq = sumlog = 0.0;
	xlik_object obj = (xlik_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);
	ir = obj->r;
	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	M = obj->M;
	s = obj->s;
	offset = obj->offset;
	np = (ir * (ir + 1)) / 2;
	naram = p + q + ps + qs;
	reg = &obj->x[offset+3*N];
	//mdisplay(reg,M,N);

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);

	for (i = 0; i < ir; ++i) {
		phi[i] = 0.0;
		theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}
	
	/*
	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}
	*/

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	
	/*
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset + i] = obj->x[offset + 2 * N + i] - b[p + q + ps + qs];
		}
	}
	*/

	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	
	iupd = 0;

	if ((ip == 1 && iq == 0) || (ip == 0 && iq == 0)) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}

	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x + offset, obj->x + offset + N, &sumlog, &ssq, iupd, delta, &iter, &nit);
	obj->ssq = ssq;
	//mdisplay(V, 1, np);

	value = 0.5 * (sumlog / (double)iter + log(ssq / (double)iter));
	obj->loglik = value;
	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	return value;
}